

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ResetNotificationStrategy::RobustnessBase::createRobustContext
          (RobustnessBase *this,ResetNotificationStrategy reset)

{
  TestContext *pTVar1;
  deUint32 bits;
  uint uVar2;
  RenderContext *pRVar3;
  RenderConfig renderCfg;
  RenderConfig local_50;
  
  uVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  local_50.type.super_ApiType.m_bits = (ApiType)(uVar2 & 0x3ff | 0x400);
  local_50.width = -1;
  local_50.height = -1;
  local_50.surfaceType = SURFACETYPE_DONT_CARE;
  local_50.windowVisibility = VISIBILITY_VISIBLE;
  local_50.id = -1;
  local_50.redBits = -1;
  local_50.greenBits = -1;
  local_50.blueBits = -1;
  local_50.alphaBits = -1;
  local_50.depthBits = -1;
  local_50.stencilBits = -1;
  local_50.numSamples = -1;
  local_50.resetNotificationStrategy = RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED;
  glu::parseRenderConfig(&local_50,((this->super_TestCase).m_context)->m_testCtx->m_cmdLine);
  local_50.surfaceType = SURFACETYPE_OFFSCREEN_GENERIC;
  pTVar1 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  local_50.resetNotificationStrategy = reset;
  pRVar3 = glu::createRenderContext(pTVar1->m_platform,pTVar1->m_cmdLine,&local_50);
  this->m_robustContext = pRVar3;
  return;
}

Assistant:

void RobustnessBase::createRobustContext(glu::ResetNotificationStrategy reset)
{
	glu::RenderConfig renderCfg(glu::ContextType(m_context.getRenderContext().getType().getAPI(), glu::CONTEXT_ROBUST));

	glu::parseRenderConfig(&renderCfg, m_context.getTestContext().getCommandLine());

	renderCfg.resetNotificationStrategy = reset;
	renderCfg.surfaceType				= glu::RenderConfig::SURFACETYPE_OFFSCREEN_GENERIC;

	m_robustContext = glu::createRenderContext(m_testCtx.getPlatform(), m_testCtx.getCommandLine(), renderCfg);
}